

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O1

void pdfDumpInfoDict(char *fname)

{
  QPDF pdf;
  QPDF local_40 [8];
  string local_38;
  
  QPDF::QPDF(local_40);
  QPDF::processFile((char *)local_40,fname);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,":\t","");
  dumpInfoDict(local_40,(ostream *)&std::cout,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  QPDF::~QPDF(local_40);
  return;
}

Assistant:

void
pdfDumpInfoDict(char const* fname)
{
    try {
        QPDF pdf;
        pdf.processFile(fname);
        dumpInfoDict(pdf);
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }
}